

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freud_triang_test.cpp
# Opt level: O3

void __thiscall freudenthal_triangulation::test_method(freudenthal_triangulation *this)

{
  double *pdVar1;
  pointer *ppuVar2;
  double dVar3;
  double dVar4;
  void *pvVar5;
  pointer piVar6;
  pointer piVar7;
  undefined1 uVar8;
  int iVar9;
  DstEvaluatorType dstEvaluator;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar10;
  pointer puVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  undefined8 *puVar13;
  long lVar14;
  char *__function;
  double *pdVar15;
  size_t i;
  long lVar16;
  pointer pvVar17;
  const_iterator cVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_02;
  initializer_list<double> __l_03;
  initializer_list<int> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_07;
  initializer_list<double> __l_08;
  initializer_list<int> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_13;
  initializer_list<double> __l_14;
  initializer_list<int> __l_15;
  initializer_list<unsigned_long> __l_16;
  initializer_list<unsigned_long> __l_17;
  initializer_list<unsigned_long> __l_18;
  initializer_list<unsigned_long> __l_19;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_20;
  initializer_list<double> __l_21;
  MatrixXd default_matrix;
  MatrixXd default_offset;
  MatrixXd new_matrix;
  Simplex_handle s_2;
  Simplex_handle s;
  Point point_1;
  Point point;
  vector<int,_std::allocator<int>_> v_1;
  Vector3d barycenter;
  FK_triangulation tr;
  vector<int,_std::allocator<int>_> local_538;
  undefined1 local_520 [24];
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_508;
  Simplex_handle local_4d8;
  char *local_4a8;
  double adStack_4a0 [2];
  long lStack_490;
  undefined1 local_488 [40];
  pointer local_460;
  undefined1 local_458 [24];
  undefined1 local_440 [24];
  undefined1 local_428 [32];
  long local_408;
  byte local_400;
  vector<double,_std::allocator<double>_> local_3f8;
  vector<int,_std::allocator<int>_> local_3e0;
  vector<int,_std::allocator<int>_> local_3c8;
  undefined1 local_3b0 [16];
  pointer local_3a0;
  pointer local_398;
  pointer local_390;
  Scalar local_388;
  Scalar local_380;
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_378;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Freudenthal_triangulation(&local_378,3);
  local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4008000000000000;
  local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbff0000000000000;
  local_488._16_8_ = (pointer)0x0;
  __l._M_len = 3;
  __l._M_array = (iterator)local_488;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_428,__l,(allocator_type *)&local_4d8);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            ((Simplex_handle *)local_488,&local_378,
             (vector<double,_std::allocator<double>_> *)local_428,1.0);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x22);
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xffffffff00000003;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish._4_4_ << 0x20);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_3f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_538,__l_00,(allocator_type *)&local_4a8);
  if (local_488._8_8_ - local_488._0_8_ ==
      (long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._1_7_,
                     local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_)) {
    if (local_488._8_8_ == local_488._0_8_) {
      bVar19 = true;
    }
    else {
      iVar9 = bcmp((void *)local_488._0_8_,
                   (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_7_,
                                    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_1_),
                   local_488._8_8_ - local_488._0_8_);
      bVar19 = iVar9 == 0;
    }
  }
  else {
    bVar19 = false;
  }
  local_508.o_it_._M_current._0_1_ = bVar19;
  local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4d8.partition_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_520;
  local_520._0_8_ = "s.vertex() == Vertex_handle({3, -1, 0})";
  local_520._8_8_ = "";
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0011bca8;
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_508.value_);
  pvVar5 = (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x23);
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x2;
  local_4d8.partition_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_4d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3f8,__l_01,
             (allocator_type *)&local_3c8);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_3f8;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_520,__l_02,(allocator_type *)&local_3e0);
  if (local_488._32_8_ - local_488._24_8_ == local_520._8_8_ - local_520._0_8_) {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)
             std::__equal<false>::
             equal<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<unsigned_long,std::allocator<unsigned_long>>const*>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._24_8_,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._32_8_,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_520._0_8_);
  }
  else {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  }
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4a8 = "s.partition() == Ordered_set_partition({Part({0, 1, 2, 3})})";
  adStack_4a0[0] = 5.48709800336934e-318;
  local_508.o_end_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
       ((ulong)local_508.o_end_._M_current & 0xffffffffffffff00);
  local_508.o_it_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&PTR__lazy_ostream_0011bca8;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_88 = "";
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_520);
  if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)(local_488 + 0x18));
  if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_ !=
      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ - local_488._0_8_);
  }
  if ((pointer)local_428._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ - local_428._0_8_);
  }
  local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x400c000000000000;
  local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbff8000000000000;
  local_488._16_8_ = (pointer)0x3fe0000000000000;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_488;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_428,__l_03,
             (allocator_type *)&local_4d8);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            ((Simplex_handle *)local_488,&local_378,
             (vector<double,_std::allocator<double>_> *)local_428,1.0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x29);
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xfffffffe00000003;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish & 0xffffffff00000000);
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_3f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_538,__l_04,(allocator_type *)&local_4a8);
  if (local_488._8_8_ - local_488._0_8_ ==
      (long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._1_7_,
                     local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_)) {
    if (local_488._8_8_ == local_488._0_8_) {
      bVar19 = true;
    }
    else {
      iVar9 = bcmp((void *)local_488._0_8_,
                   (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_7_,
                                    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_1_),
                   local_488._8_8_ - local_488._0_8_);
      bVar19 = iVar9 == 0;
    }
  }
  else {
    bVar19 = false;
  }
  local_508.o_it_._M_current._0_1_ = bVar19;
  local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_520._0_8_ = "s.vertex() == Vertex_handle({3, -2, 0})";
  local_520._8_8_ = "";
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0011bca8;
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_b8 = "";
  local_4d8.partition_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_508.value_);
  pvVar5 = (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2a);
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x2;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_3f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4d8,__l_05,
             (allocator_type *)&local_3e0);
  local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_3c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4d8.partition_,__l_06,
             (allocator_type *)local_3b0);
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_4d8;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_520,__l_07,(allocator_type *)&local_3a0);
  if (local_488._32_8_ - local_488._24_8_ == local_520._8_8_ - local_520._0_8_) {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)
             std::__equal<false>::
             equal<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<unsigned_long,std::allocator<unsigned_long>>const*>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._24_8_,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._32_8_,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_520._0_8_);
  }
  else {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  }
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4a8 = "s.partition() == Ordered_set_partition({Part({0, 1, 2}), Part({3})})";
  adStack_4a0[0] = 5.48763653492331e-318;
  local_508.o_end_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
       ((ulong)local_508.o_end_._M_current & 0xffffffffffffff00);
  local_508.o_it_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&PTR__lazy_ostream_0011bca8;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_e8 = "";
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_520);
  lVar16 = 0x30;
  do {
    pvVar5 = *(void **)((long)&local_508.value_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar16);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)(&local_508.is_end_ + lVar16) - (long)pvVar5);
    }
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != 0);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)(local_488 + 0x18));
  if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_ !=
      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ - local_488._0_8_);
  }
  if ((pointer)local_428._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ - local_428._0_8_);
  }
  local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x400c000000000000;
  local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbffccccccccccccd;
  local_488._16_8_ = (pointer)0x3fe0000000000000;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)local_488;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_428,__l_08,
             (allocator_type *)&local_4d8);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            (&local_4d8,&local_378,(vector<double,_std::allocator<double>_> *)local_428,1.0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x30);
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xfffffffe00000003;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish & 0xffffffff00000000);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_3f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_538,__l_09,(allocator_type *)&local_4a8);
  if ((long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._1_7_,
                     local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_)) {
    if (local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar19 = true;
    }
    else {
      iVar9 = bcmp(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_7_,
                                    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_1_),
                   (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      bVar19 = iVar9 == 0;
    }
  }
  else {
    bVar19 = false;
  }
  local_508.o_it_._M_current._0_1_ = bVar19;
  local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_520._0_8_ = "s.vertex() == Vertex_handle({3, -2, 0})";
  local_520._8_8_ = "";
  local_488._8_8_ = local_488._8_8_ & 0xffffffffffffff00;
  local_488._0_8_ = &PTR__lazy_ostream_0011bca8;
  local_488._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_118 = "";
  local_488._24_8_ =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_508.value_);
  pvVar5 = (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x31);
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x2;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&local_3f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,__l_10,
             (allocator_type *)local_3b0);
  local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)&local_3c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_488 + 0x18),__l_11,
             (allocator_type *)&local_3a0);
  local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3;
  __l_12._M_len = 1;
  __l_12._M_array = (iterator)&local_3e0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458,__l_12,
             (allocator_type *)&local_390);
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)local_488;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_520,__l_13,(allocator_type *)&local_398);
  if ((long)local_4d8.partition_.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_4d8.partition_.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == local_520._8_8_ - local_520._0_8_) {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)
             std::__equal<false>::
             equal<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<unsigned_long,std::allocator<unsigned_long>>const*>
                       (local_4d8.partition_.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        local_4d8.partition_.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_520._0_8_);
  }
  else {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  }
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4a8 = "s.partition() == Ordered_set_partition({Part({0, 2}), Part({1}), Part({3})})";
  adStack_4a0[0] = 5.48801696547061e-318;
  local_508.o_end_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
       ((ulong)local_508.o_end_._M_current & 0xffffffffffffff00);
  local_508.o_it_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&PTR__lazy_ostream_0011bca8;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_148 = "";
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_520);
  lVar16 = 0x48;
  do {
    pvVar5 = *(void **)((long)adStack_4a0 + lVar16);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)((long)&lStack_490 + lVar16) - (long)pvVar5);
    }
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != 0);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_4d8.partition_);
  if ((undefined **)
      local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (undefined **)0x0) {
    operator_delete(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_428._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ - local_428._0_8_);
  }
  local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x400c000000000000;
  local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbffccccccccccccd;
  local_488._16_8_ = (pointer)0x3fd3333333333333;
  __l_14._M_len = 3;
  __l_14._M_array = (iterator)local_488;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_428,__l_14,
             (allocator_type *)&local_4d8);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<std::vector<double,std::allocator<double>>>
            (&local_4d8,&local_378,(vector<double,_std::allocator<double>_> *)local_428,1.0);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x37);
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xfffffffe00000003;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish & 0xffffffff00000000);
  __l_15._M_len = 3;
  __l_15._M_array = (iterator)&local_3f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_538,__l_15,(allocator_type *)&local_4a8);
  if ((long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._1_7_,
                     local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_)) {
    if (local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar19 = true;
    }
    else {
      iVar9 = bcmp(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_7_,
                                    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_1_),
                   (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      bVar19 = iVar9 == 0;
    }
  }
  else {
    bVar19 = false;
  }
  local_508.o_it_._M_current._0_1_ = bVar19;
  local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_520._0_8_ = "s.vertex() == Vertex_handle({3, -2, 0})";
  local_520._8_8_ = "";
  local_488._8_8_ = local_488._8_8_ & 0xffffffffffffff00;
  local_488._0_8_ = &PTR__lazy_ostream_0011bca8;
  local_488._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_178 = "";
  local_488._24_8_ =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_508.value_);
  pvVar5 = (void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x38);
  local_4a8 = (char *)0x0;
  __l_16._M_len = 1;
  __l_16._M_array = (iterator)&local_4a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,__l_16,
             (allocator_type *)&local_3a0);
  local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x2;
  __l_17._M_len = 1;
  __l_17._M_array = (iterator)&local_3c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_488 + 0x18),__l_17,
             (allocator_type *)&local_390);
  local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  __l_18._M_len = 1;
  __l_18._M_array = (iterator)&local_3e0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458,__l_18,
             (allocator_type *)&local_398);
  local_3b0._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3;
  __l_19._M_len = 1;
  __l_19._M_array = (iterator)local_3b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_440,__l_19,
             (allocator_type *)&local_380);
  __l_20._M_len = 4;
  __l_20._M_array = (iterator)local_488;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_520,__l_20,(allocator_type *)&local_388);
  if ((long)local_4d8.partition_.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_4d8.partition_.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == local_520._8_8_ - local_520._0_8_) {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)
             std::__equal<false>::
             equal<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<unsigned_long,std::allocator<unsigned_long>>const*>
                       (local_4d8.partition_.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        local_4d8.partition_.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_520._0_8_);
  }
  else {
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_1_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  }
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x10f304;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x10f358;
  local_508.o_end_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
       ((ulong)local_508.o_end_._M_current & 0xffffffffffffff00);
  local_508.o_it_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&PTR__lazy_ostream_0011bca8;
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_1a8 = "";
  local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&local_3f8;
  boost::test_tools::tt_detail::report_assertion(&local_538,&local_508,&local_1b0,0x38,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_520);
  lVar16 = 0x60;
  do {
    pvVar5 = *(void **)((long)adStack_4a0 + lVar16);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)((long)&lStack_490 + lVar16) - (long)pvVar5);
    }
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != 0);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_4d8.partition_);
  if ((undefined **)
      local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (undefined **)0x0) {
    operator_delete(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_428._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ - local_428._0_8_);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x3c);
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_378.dimension_ == 3);
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_508.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10f359;
  local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10f36c;
  local_488._8_8_ = local_488._8_8_ & 0xffffffffffffff00;
  local_488._0_8_ = &PTR__lazy_ostream_0011bca8;
  local_488._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_1d8 = "";
  local_488._24_8_ = &local_508;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3;
  local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_538,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_488);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x3f);
  if (((pointer)local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows ==
       local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish) &&
     ((pointer)local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols ==
      local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage)) {
    if (local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
        .m_cols < 1) {
      bVar19 = true;
    }
    else {
      lVar16 = CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._1_7_,
                        local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_1_);
      bVar19 = false;
      pvVar17 = (pointer)0x0;
      pdVar15 = local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      do {
        if (0 < local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows) {
          pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
          do {
            pdVar1 = (double *)(lVar16 + (long)pvVar12 * 8);
            if ((pdVar15[(long)pvVar12] != *pdVar1) || (NAN(pdVar15[(long)pvVar12]) || NAN(*pdVar1))
               ) goto LAB_00103c7d;
            pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      ((long)&(pvVar12->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1);
          } while ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   local_378.matrix_.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
                   != pvVar12);
        }
        pvVar17 = (pointer)((long)&(pvVar17->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
        lVar16 = lVar16 + local_378.matrix_.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_rows * 8;
        pdVar15 = pdVar15 + local_378.matrix_.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows;
        bVar19 = local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols <= (long)pvVar17;
      } while (pvVar17 !=
               (pointer)local_378.matrix_.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
    }
LAB_00103c7d:
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,bVar19);
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_508.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10f36d;
    local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10f38a;
    local_488._8_8_ = local_488._8_8_ & 0xffffffffffffff00;
    local_488._0_8_ = &PTR__lazy_ostream_0011bca8;
    local_488._16_8_ = &boost::unit_test::lazy_ostream::inst;
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
    ;
    local_208 = "";
    local_488._24_8_ = &local_508;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3;
    local_488._16_8_ = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_520,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_488);
    local_220 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x42);
    if ((local_378.offset_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != local_520._8_8_) || ((pointer)local_520._16_8_ != (pointer)0x1)) {
      __function = 
      "Eigen::CwiseBinaryOp<Eigen::numext::equal_to<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::equal_to<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_00104aca;
    }
    uVar8 = 1;
    if (0 < local_378.offset_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows) {
      pvVar17 = (pointer)0x0;
      do {
        ppuVar2 = &(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_520._0_8_)
                   ->_M_impl).super__Vector_impl_data._M_start + (long)pvVar17;
        if ((local_378.offset_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data[(long)pvVar17] != (double)*ppuVar2) ||
           (NAN(local_378.offset_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[(long)pvVar17]) || NAN((double)*ppuVar2))) {
          uVar8 = 0;
          break;
        }
        pvVar17 = (pointer)((long)&(pvVar17->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
      } while ((pointer)local_378.offset_.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows != pvVar17);
    }
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,uVar8);
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_508.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10f38b;
    local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10f3a8;
    local_488._8_8_ = local_488._8_8_ & 0xffffffffffffff00;
    local_488._0_8_ = &PTR__lazy_ostream_0011bca8;
    local_488._16_8_ = &boost::unit_test::lazy_ostream::inst;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
    ;
    local_238 = "";
    local_488._24_8_ = &local_508;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x400c000000000000;
    local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbffccccccccccccd;
    local_488._16_8_ = (pointer)0x3fd3333333333333;
    __l_21._M_len = 3;
    __l_21._M_array = (iterator)local_488;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_3f8,__l_21,(allocator_type *)&local_4d8);
    Gudhi::coxeter_triangulation::
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
    ::locate_point<std::vector<double,std::allocator<double>>>(&local_4d8,&local_378,&local_3f8,1.0)
    ;
    local_4a8 = (char *)0x0;
    adStack_4a0[0] = 0.0;
    adStack_4a0[1] = 0.0;
    Gudhi::coxeter_triangulation::
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::vertex_range((Vertex_range *)local_488,&local_4d8);
    local_508.o_it_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_;
    local_508.o_end_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._8_8_;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_508.value_,(vector<int,_std::allocator<int>_> *)(local_488 + 0x10));
    local_508.is_end_ = local_460._0_1_;
    local_428._0_8_ = local_458._0_8_;
    local_428._8_8_ = local_458._8_8_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(local_428 + 0x10),
               (vector<int,_std::allocator<int>_> *)(local_458 + 0x10));
    local_400 = local_440[0x10];
    if ((local_508.is_end_ & local_440[0x10]) == 0) {
      do {
        std::vector<int,_std::allocator<int>_>::vector(&local_3c8,&local_508.value_);
        if ((long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          if ((pointer)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00103f85;
        }
        else {
          lVar16 = (long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          lVar14 = 0;
          do {
            if (lVar14 == 3) goto LAB_001049b8;
            (&local_4a8)[lVar14] =
                 (char *)((double)*(int *)((long)local_3c8.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start +
                                          lVar14 * 4) + (double)(&local_4a8)[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar16 + (ulong)(lVar16 == 0) != lVar14);
LAB_00103f85:
          operator_delete(local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_508.is_end_ == false) {
          Gudhi::coxeter_triangulation::
          Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::update_value(&local_508);
          local_508.o_it_._M_current = local_508.o_it_._M_current + 1;
          if (local_508.o_it_._M_current == local_508.o_end_._M_current) {
            local_508.is_end_ = true;
          }
        }
      } while (((local_508.is_end_ & 1U) == 0) || ((local_400 & 1) == 0));
    }
    if ((pointer)local_428._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_428._16_8_,local_408 - local_428._16_8_);
    }
    if ((pointer)local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_458._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_458._16_8_,local_440._8_8_ - local_458._16_8_);
    }
    if ((pointer)local_488._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_488._16_8_,local_488._32_8_ - local_488._16_8_);
    }
    local_4a8 = (char *)((double)local_4a8 * 0.25);
    adStack_4a0[0] = adStack_4a0[0] * 0.25;
    adStack_4a0[1] = adStack_4a0[1] * 0.25;
    Gudhi::coxeter_triangulation::
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::barycenter((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)local_488,(Simplex_handle *)&local_378,1.0);
    if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._8_8_ !=
        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3) {
LAB_001049f1:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
                   );
    }
    local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_
                     )->_M_impl).super__Vector_impl_data._M_start;
    local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                          local_488._0_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_)
                  ->_M_impl).super__Vector_impl_data._M_end_of_storage;
    free((void *)local_488._0_8_);
    lVar16 = 0;
    do {
      GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>
                ((double)(&local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start)[lVar16],(double)(&local_4a8)[lVar16],
                 1e-07);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    Gudhi::coxeter_triangulation::
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
    ::locate_point<std::vector<double,std::allocator<double>>>
              ((Simplex_handle *)local_488,&local_378,&local_3f8,2.0);
    piVar7 = local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    piVar6 = local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_488._0_8_;
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_488._8_8_;
    local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_488._16_8_;
    local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_488._16_8_ = (pointer)0x0;
    if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)piVar6 !=
        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      operator_delete(piVar6,(long)piVar7 - (long)piVar6);
    }
    local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_4d8.partition_.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_508.o_end_._M_current =
         local_4d8.partition_.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_508.o_it_._M_current =
         local_4d8.partition_.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_4d8.partition_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_460;
    local_4d8.partition_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_488._24_8_;
    local_4d8.partition_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_488._32_8_;
    local_488._24_8_ =
         (Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *)0x0;
    local_488._32_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_460 = (pointer)0x0;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)&local_508);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_488 + 0x18));
    if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_ !=
        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      operator_delete((void *)local_488._0_8_,local_488._16_8_ - local_488._0_8_);
    }
    local_4a8 = (char *)0x0;
    adStack_4a0[0] = 0.0;
    adStack_4a0[1] = 0.0;
    Gudhi::coxeter_triangulation::
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::vertex_range((Vertex_range *)local_488,&local_4d8);
    local_508.o_it_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_;
    local_508.o_end_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._8_8_;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_508.value_,(vector<int,_std::allocator<int>_> *)(local_488 + 0x10));
    local_508.is_end_ = local_460._0_1_;
    local_428._0_8_ = local_458._0_8_;
    local_428._8_8_ = local_458._8_8_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(local_428 + 0x10),
               (vector<int,_std::allocator<int>_> *)(local_458 + 0x10));
    local_400 = local_440[0x10];
    if ((local_508.is_end_ & local_440[0x10]) == 0) {
      do {
        std::vector<int,_std::allocator<int>_>::vector(&local_3e0,&local_508.value_);
        if ((long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_001042dc;
        }
        else {
          lVar16 = (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          lVar14 = 0;
          do {
            if (lVar14 == 3) {
LAB_001049b8:
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 3, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 3, 1>, Level = 1]"
                           );
            }
            (&local_4a8)[lVar14] =
                 (char *)((double)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar14] +
                         (double)(&local_4a8)[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar16 + (ulong)(lVar16 == 0) != lVar14);
LAB_001042dc:
          operator_delete(local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_508.is_end_ == false) {
          Gudhi::coxeter_triangulation::
          Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::update_value(&local_508);
          local_508.o_it_._M_current = local_508.o_it_._M_current + 1;
          if (local_508.o_it_._M_current == local_508.o_end_._M_current) {
            local_508.is_end_ = true;
          }
        }
      } while (((local_508.is_end_ & 1U) == 0) || ((local_400 & 1) == 0));
    }
    if ((pointer)local_428._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_428._16_8_,local_408 - local_428._16_8_);
    }
    if ((pointer)local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_458._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_458._16_8_,local_440._8_8_ - local_458._16_8_);
    }
    if ((pointer)local_488._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_488._16_8_,local_488._32_8_ - local_488._16_8_);
    }
    auVar20._8_8_ = adStack_4a0[0];
    auVar20._0_8_ = local_4a8;
    auVar20 = divpd(auVar20,_DAT_0010f070);
    local_4a8 = (char *)(auVar20._0_8_ * 0.5);
    adStack_4a0[0] = auVar20._8_8_ * 0.5;
    adStack_4a0[1] = (adStack_4a0[1] / 3.0) * 0.5;
    Gudhi::coxeter_triangulation::
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::barycenter((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)local_488,(Simplex_handle *)&local_378,2.0);
    if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._8_8_ !=
        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3) goto LAB_001049f1;
    local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_
                     )->_M_impl).super__Vector_impl_data._M_start;
    local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                          local_488._0_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_)
                  ->_M_impl).super__Vector_impl_data._M_end_of_storage;
    free((void *)local_488._0_8_);
    lVar16 = 0;
    do {
      GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>
                ((double)(&local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start)[lVar16],(double)(&local_4a8)[lVar16],
                 1e-07);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    local_508.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_508.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_508,9,3,3);
    local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_488._16_8_ = (pointer)0x1;
    local_488._24_8_ =
         (Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *)0x1;
    local_488._0_8_ = &local_508;
    if (((long)local_508.o_end_._M_current < 1) ||
       ((long)local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start < 1)) {
      __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                    "Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    ((local_508.o_it_._M_current)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
    local_428._0_8_ = (pointer)0x0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_488,
                         (Scalar *)local_428);
    local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)&local_3e0);
    local_3b0._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbff0000000000000;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)local_3b0);
    local_3a0 = (pointer)0x3ff0000000000000;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)&local_3a0);
    local_390 = (pointer)0x0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)&local_390);
    local_398 = (pointer)0xbff0000000000000;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)&local_398);
    local_380 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_380);
    local_388 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar10,&local_388);
    puVar11 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_)->
              _M_impl).super__Vector_impl_data._M_end_of_storage;
    if ((pointer)((long)&(((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)local_488._24_8_)->_M_impl).super__Vector_impl_data._M_start +
                 (long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                         local_488._8_8_)->_M_impl).super__Vector_impl_data._M_start) !=
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_488._0_8_)->_M_impl).
        super__Vector_impl_data._M_finish) {
      if (puVar11 != (pointer)0x0) goto LAB_00104a10;
      puVar11 = (pointer)0x0;
    }
    if ((pointer)local_488._16_8_ != puVar11) {
LAB_00104a10:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_428._0_8_ = (pointer)0x3ff8000000000000;
    local_428._8_8_ = (pointer)0x3ff0000000000000;
    local_428._16_8_ = (pointer)0x3fe0000000000000;
    Gudhi::coxeter_triangulation::
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::change_matrix(&local_378,(MatrixXd *)&local_508);
    local_488._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)malloc(0x18);
    if (((ulong)pvVar12 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pvVar12 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = operator_delete;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_488._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3;
    (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_428._0_8_;
    (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_428._8_8_;
    (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x3fe0000000000000;
    local_488._0_8_ = pvVar12;
    Gudhi::coxeter_triangulation::
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::change_offset(&local_378,(VectorXd *)local_488);
    free((void *)local_488._0_8_);
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
    ;
    local_248 = "";
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x61);
    if (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows == local_508.o_end_._M_current) &&
       ((pointer)local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols ==
        local_508.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      if (local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1) {
        bVar19 = true;
      }
      else {
        bVar19 = false;
        pvVar17 = (pointer)0x0;
        pdVar15 = local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_data;
        cVar18._M_current = local_508.o_it_._M_current;
        do {
          if (0 < local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_rows) {
            pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
            do {
              pdVar1 = (double *)
                       ((long)&((cVar18._M_current)->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl + (long)pvVar12 * 8);
              if ((pdVar15[(long)pvVar12] != *pdVar1) ||
                 (NAN(pdVar15[(long)pvVar12]) || NAN(*pdVar1))) goto LAB_0010472e;
              pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&(pvVar12->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + 1);
            } while ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     local_378.matrix_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows != pvVar12);
          }
          pvVar17 = (pointer)((long)&(pvVar17->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
          cVar18._M_current =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&((cVar18._M_current)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl +
               local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows * 8);
          pdVar15 = pdVar15 + local_378.matrix_.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          bVar19 = local_378.matrix_.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
                   <= (long)pvVar17;
        } while (pvVar17 !=
                 (pointer)local_378.matrix_.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols);
      }
LAB_0010472e:
      local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,bVar19);
      local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_3b0._0_8_ = "tr.matrix() == new_matrix";
      local_3b0._8_8_ = "";
      local_488._8_8_ = local_488._8_8_ & 0xffffffffffffff00;
      local_488._0_8_ = &PTR__lazy_ostream_0011bca8;
      local_488._16_8_ = &boost::unit_test::lazy_ostream::inst;
      local_270 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
      ;
      local_268 = "";
      local_488._24_8_ =
           (Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *)local_3b0;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_280 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
      ;
      local_278 = "";
      local_290 = &boost::unit_test::basic_cstring<char_const>::null;
      local_288 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x62);
      if ((pointer)local_378.offset_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows == (pointer)0x3) {
        lVar16 = 0;
        do {
          dVar3 = local_378.offset_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[lVar16];
          dVar4 = *(double *)(local_428 + lVar16 * 8);
          if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) break;
          bVar19 = lVar16 != 2;
          lVar16 = lVar16 + 1;
        } while (bVar19);
        local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT71(local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._1_7_,dVar3 == dVar4);
        local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_3b0._0_8_ = "tr.offset() == new_offset";
        local_3b0._8_8_ = "";
        local_488._8_8_ = local_488._8_8_ & 0xffffffffffffff00;
        local_488._0_8_ = &PTR__lazy_ostream_0011bca8;
        local_488._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_2a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/freud_triang_test.cpp"
        ;
        local_298 = "";
        local_488._24_8_ =
             (Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              *)local_3b0;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        free(local_508.o_it_._M_current);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_4d8.partition_);
        if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
          operator_delete(local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4d8.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        free((void *)local_520._0_8_);
        free((void *)CONCAT71(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._1_7_,
                              local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_1_));
        free(local_378.colpivhouseholderqr_.m_colNormsDirect.
             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_378.colpivhouseholderqr_.m_colNormsUpdated.
             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_378.colpivhouseholderqr_.m_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_378.colpivhouseholderqr_.m_colsTranspositions.
             super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_378.colpivhouseholderqr_.m_colsPermutation.m_indices.
             super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_378.colpivhouseholderqr_.m_hCoeffs.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_378.colpivhouseholderqr_.m_qr.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
        free(local_378.offset_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_378.matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        return;
      }
      __function = 
      "Eigen::CwiseBinaryOp<Eigen::numext::equal_to<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::equal_to<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, 3, 1>]"
      ;
      goto LAB_00104aca;
    }
  }
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::numext::equal_to<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::equal_to<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00104aca:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

BOOST_AUTO_TEST_CASE(freudenthal_triangulation) {
  // Point location check
  typedef std::vector<double> Point;
  typedef Gudhi::coxeter_triangulation::Freudenthal_triangulation<> FK_triangulation;
  typedef typename FK_triangulation::Simplex_handle Simplex_handle;
  typedef typename FK_triangulation::Vertex_handle Vertex_handle;
  typedef typename Simplex_handle::OrderedSetPartition Ordered_set_partition;
  typedef typename Ordered_set_partition::value_type Part;

  FK_triangulation tr(3);

  // Point location check
  {
    Point point({3, -1, 0});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -1, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0, 1, 2, 3})}));
  }

  {
    Point point({3.5, -1.5, 0.5});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -2, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0, 1, 2}), Part({3})}));
  }

  {
    Point point({3.5, -1.8, 0.5});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -2, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0, 2}), Part({1}), Part({3})}));
  }

  {
    Point point({3.5, -1.8, 0.3});
    Simplex_handle s = tr.locate_point(point);
    BOOST_CHECK(s.vertex() == Vertex_handle({3, -2, 0}));
    BOOST_CHECK(s.partition() == Ordered_set_partition({Part({0}), Part({2}), Part({1}), Part({3})}));
  }

  // Dimension check
  BOOST_CHECK(tr.dimension() == 3);
  // Matrix check
  Eigen::MatrixXd default_matrix = Eigen::MatrixXd::Identity(3, 3);
  BOOST_CHECK(tr.matrix() == default_matrix);
  // Vector check
  Eigen::MatrixXd default_offset = Eigen::VectorXd::Zero(3);
  BOOST_CHECK(tr.offset() == default_offset);

  // Barycenter check
  Point point({3.5, -1.8, 0.3});
  Simplex_handle s = tr.locate_point(point);
  Eigen::Vector3d barycenter_cart = Eigen::Vector3d::Zero();
  for (auto v : s.vertex_range())
    for (std::size_t i = 0; i < v.size(); i++) barycenter_cart(i) += v[i];
  barycenter_cart /= 4.;  // simplex is three-dimensional
  Eigen::Vector3d barycenter = tr.barycenter(s);
  for (std::size_t i = 0; (long int)i < barycenter.size(); i++)
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(barycenter(i), barycenter_cart(i), 1e-7);

  // Barycenter check for twice the scale
  s = tr.locate_point(point, 2);
  barycenter_cart = Eigen::Vector3d::Zero();
  for (auto v : s.vertex_range())
    for (std::size_t i = 0; i < v.size(); i++) barycenter_cart(i) += v[i];
  barycenter_cart /= 3.;  // simplex is now a two-dimensional face
  barycenter_cart /= 2.;  // scale
  barycenter = tr.barycenter(s, 2);
  for (std::size_t i = 0; (long int)i < barycenter.size(); i++)
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(barycenter(i), barycenter_cart(i), 1e-7);

  // Matrix and offset change check
  Eigen::MatrixXd new_matrix(3, 3);
  new_matrix << 1, 0, 0, -1, 1, 0, -1, 0, 1;
  Eigen::Vector3d new_offset(1.5, 1, 0.5);
  tr.change_matrix(new_matrix);
  tr.change_offset(new_offset);

  BOOST_CHECK(tr.matrix() == new_matrix);
  BOOST_CHECK(tr.offset() == new_offset);
}